

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

ParseStatus
re2::ParseUnicodeGroup
          (StringPiece *s,ParseFlags parse_flags,CharClassBuilder *cc,RegexpStatus *status)

{
  char cVar1;
  bool bVar2;
  ParseFlags PVar3;
  int iVar4;
  iterator pcVar5;
  iterator pcVar6;
  iterator pcVar7;
  UGroup *g_00;
  UGroup *g;
  int local_90;
  StringPiece local_88;
  size_type local_78;
  size_t end;
  int local_68;
  char *local_60;
  char *p;
  StringPiece name;
  StringPiece seq;
  int sign;
  Rune c;
  RegexpStatus *status_local;
  CharClassBuilder *cc_local;
  ParseFlags parse_flags_local;
  StringPiece *s_local;
  
  PVar3 = operator&(parse_flags,UnicodeGroups);
  if (PVar3 == NoParseFlags) {
    s_local._4_4_ = kParseNothing;
  }
  else {
    iVar4 = StringPiece::size(s);
    if ((iVar4 < 2) || (cVar1 = StringPiece::operator[](s,0), cVar1 != '\\')) {
      s_local._4_4_ = kParseNothing;
    }
    else {
      cVar1 = StringPiece::operator[](s,1);
      seq._12_4_ = SEXT14(cVar1);
      if ((seq._12_4_ == 0x70) || (seq._12_4_ == 0x50)) {
        seq.length_ = 1;
        if (seq._12_4_ == 0x50) {
          seq.length_ = -1;
        }
        name._8_8_ = s->ptr_;
        seq.ptr_ = *(char **)&s->length_;
        StringPiece::StringPiece((StringPiece *)&p);
        StringPiece::remove_prefix(s,2);
        iVar4 = StringPieceToRune((Rune *)&seq.field_0xc,s,status);
        if (iVar4 == 0) {
          s_local._4_4_ = kParseError;
        }
        else {
          if (seq._12_4_ == 0x7b) {
            local_78 = StringPiece::find(s,'}',0);
            if (local_78 == 0xffffffffffffffff) {
              bVar2 = IsValidUTF8((StringPiece *)&name.length_,status);
              if (!bVar2) {
                return kParseError;
              }
              RegexpStatus::set_code(status,kRegexpBadCharRange);
              RegexpStatus::set_error_arg(status,(StringPiece *)&name.length_);
              return kParseError;
            }
            pcVar5 = StringPiece::begin(s);
            StringPiece::StringPiece(&local_88,pcVar5,(int)local_78);
            p = local_88.ptr_;
            name.ptr_._0_4_ = local_88.length_;
            StringPiece::remove_prefix(s,(int)local_78 + 1);
            bVar2 = IsValidUTF8((StringPiece *)&p,status);
            if (!bVar2) {
              return kParseError;
            }
          }
          else {
            pcVar5 = StringPiece::begin((StringPiece *)&name.length_);
            local_60 = pcVar5 + 2;
            pcVar6 = StringPiece::begin(s);
            StringPiece::StringPiece((StringPiece *)&end,pcVar5 + 2,(int)pcVar6 - (int)local_60);
            p = (char *)end;
            name.ptr_._0_4_ = local_68;
          }
          pcVar5 = StringPiece::begin((StringPiece *)&name.length_);
          pcVar6 = StringPiece::begin(s);
          pcVar7 = StringPiece::begin((StringPiece *)&name.length_);
          StringPiece::StringPiece((StringPiece *)&g,pcVar5,(int)pcVar6 - (int)pcVar7);
          name._8_8_ = g;
          seq.ptr_ = (char *)CONCAT44(seq.ptr_._4_4_,local_90);
          iVar4 = StringPiece::size((StringPiece *)&p);
          if ((0 < iVar4) && (cVar1 = StringPiece::operator[]((StringPiece *)&p,0), cVar1 == '^')) {
            seq.length_ = -seq.length_;
            StringPiece::remove_prefix((StringPiece *)&p,1);
          }
          g_00 = LookupUnicodeGroup((StringPiece *)&p);
          if (g_00 == (UGroup *)0x0) {
            RegexpStatus::set_code(status,kRegexpBadCharRange);
            RegexpStatus::set_error_arg(status,(StringPiece *)&name.length_);
            s_local._4_4_ = kParseError;
          }
          else {
            AddUGroup(cc,g_00,seq.length_,parse_flags);
            s_local._4_4_ = kParseOk;
          }
        }
      }
      else {
        s_local._4_4_ = kParseNothing;
      }
    }
  }
  return s_local._4_4_;
}

Assistant:

ParseStatus ParseUnicodeGroup(StringPiece* s, Regexp::ParseFlags parse_flags,
                              CharClassBuilder *cc,
                              RegexpStatus* status) {
  // Decide whether to parse.
  if (!(parse_flags & Regexp::UnicodeGroups))
    return kParseNothing;
  if (s->size() < 2 || (*s)[0] != '\\')
    return kParseNothing;
  Rune c = (*s)[1];
  if (c != 'p' && c != 'P')
    return kParseNothing;

  // Committed to parse.  Results:
  int sign = +1;  // -1 = negated char class
  if (c == 'P')
    sign = -sign;
  StringPiece seq = *s;  // \p{Han} or \pL
  StringPiece name;  // Han or L
  s->remove_prefix(2);  // '\\', 'p'

  if (!StringPieceToRune(&c, s, status))
    return kParseError;
  if (c != '{') {
    // Name is the bit of string we just skipped over for c.
    const char* p = seq.begin() + 2;
    name = StringPiece(p, static_cast<int>(s->begin() - p));
  } else {
    // Name is in braces. Look for closing }
    size_t end = s->find('}', 0);
    if (end == s->npos) {
      if (!IsValidUTF8(seq, status))
        return kParseError;
      status->set_code(kRegexpBadCharRange);
      status->set_error_arg(seq);
      return kParseError;
    }
    name = StringPiece(s->begin(), static_cast<int>(end));  // without '}'
    s->remove_prefix(static_cast<int>(end) + 1);  // with '}'
    if (!IsValidUTF8(name, status))
      return kParseError;
  }

  // Chop seq where s now begins.
  seq = StringPiece(seq.begin(), static_cast<int>(s->begin() - seq.begin()));

  if (name.size() > 0 && name[0] == '^') {
    sign = -sign;
    name.remove_prefix(1);  // '^'
  }

#if !defined(RE2_USE_ICU)
  // Look up the group in the RE2 Unicode data.
  const UGroup *g = LookupUnicodeGroup(name);
  if (g == NULL) {
    status->set_code(kRegexpBadCharRange);
    status->set_error_arg(seq);
    return kParseError;
  }

  AddUGroup(cc, g, sign, parse_flags);
#else
  // Look up the group in the ICU Unicode data. Because ICU provides full
  // Unicode properties support, this could be more than a lookup by name.
  ::icu::UnicodeString ustr = ::icu::UnicodeString::fromUTF8(
      string("\\p{") + name.ToString() + string("}"));
  UErrorCode uerr = U_ZERO_ERROR;
  ::icu::UnicodeSet uset(ustr, uerr);
  if (U_FAILURE(uerr)) {
    status->set_code(kRegexpBadCharRange);
    status->set_error_arg(seq);
    return kParseError;
  }

  // Convert the UnicodeSet to a URange32 and UGroup that we can add.
  int nr = uset.getRangeCount();
  URange32* r = new URange32[nr];
  for (int i = 0; i < nr; i++) {
    r[i].lo = uset.getRangeStart(i);
    r[i].hi = uset.getRangeEnd(i);
  }
  UGroup g = {"", +1, 0, 0, r, nr};
  AddUGroup(cc, &g, sign, parse_flags);
  delete[] r;
#endif

  return kParseOk;
}